

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_parse<wchar_t>::parse_currency<true>
          (base_num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  undefined1 auVar1 [12];
  int iVar2;
  moneypunct *pmVar3;
  money_get *pmVar4;
  uint uVar5;
  iter_type iVar6;
  locale loc;
  longdouble local_48;
  
  std::locale::locale(&loc,(locale *)(ios + 0xd0));
  pmVar3 = std::use_facet<std::__cxx11::moneypunct<wchar_t,true>>(&loc);
  iVar2 = (**(code **)(*(long *)pmVar3 + 0x40))(pmVar3);
  pmVar4 = std::
           use_facet<std::__cxx11::money_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&loc);
  auVar1 = (**(code **)(*(long *)pmVar4 + 0x10))
                     (pmVar4,in._M_sbuf,in._M_c,end._M_sbuf,end._M_c,1,ios,err,&local_48);
  if ((*err & _S_failbit) == _S_goodbit) {
    if (0 < iVar2) {
      uVar5 = iVar2 + 1;
      do {
        local_48 = local_48 / (longdouble)10.0;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    *val = local_48;
  }
  std::locale::~locale(&loc);
  iVar6._12_4_ = 0;
  iVar6._M_sbuf = (streambuf_type *)auVar1._0_8_;
  iVar6._M_c = auVar1._8_4_;
  return iVar6;
}

Assistant:

iter_type parse_currency(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,long double &val) const
    {
        std::locale loc = ios.getloc();
        int digits = std::use_facet<std::moneypunct<char_type,intl> >(loc).frac_digits();
        long double rval;
        in = std::use_facet<std::money_get<char_type> >(loc).get(in,end,intl,ios,err,rval);
        if(!(err & std::ios::failbit)) {
            while(digits > 0) {
                rval/=10;
                digits --;
            }
            val = rval;
        }
        return in;
    }